

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O2

bool __thiscall Polymer::CheckMaskCollisions(Polymer *this,Ptr *pol)

{
  int iVar1;
  element_type *peVar2;
  bool bVar3;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string err;
  
  iVar1 = (this->mask_).super_MobileElement.start_;
  if (iVar1 <= this->stop_) {
    peVar2 = (pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (iVar1 <= peVar2->stop_) {
      if (3 < peVar2->stop_ - iVar1) {
        std::operator+(&local_50,"Polymerase ",&peVar2->name_);
        std::operator+(&err,&local_50," is overlapping mask by more than one codon on polymer");
        std::__cxx11::string::~string((string *)&local_50);
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,(string *)&err);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar3 = Mask::CheckInteraction(&this->mask_,&peVar2->name_);
      if (!bVar3) {
        bVar3 = std::operator==(&((pol->
                                  super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr)->name_,"__rnase");
        if (!bVar3) {
          return true;
        }
        if (this->attached_ != false) {
          return true;
        }
        if (this->degraded_elements_ != this->total_elements_) {
          return true;
        }
        if ((this->polymerases_).pol_count_ != 0) {
          return true;
        }
        this->degrade_ = true;
        return true;
      }
      (*this->_vptr_Polymer[2])(this);
    }
  }
  return false;
}

Assistant:

BindingSite::Ptr Polymer::FindBindingSite(MobileElement::Ptr pol,
                                          const std::string &promoter_name) {
  // Make a list of free promoters that pol can bind
  bool found = false;
  BindingSite::VecPtr promoter_choices;
  std::vector<Interval<BindingSite::Ptr>> results;
  binding_sites_.findOverlapping(start_, mask_.start(), results);
  for (auto &interval : results) {
    if (interval.value->name() == promoter_name &&
        !interval.value->IsCovered()) {
      promoter_choices.push_back(interval.value);
      found = true;
    }
  }
  // Error checking
  if (!found) {
    std::string err = "Polymerase " + pol->name() +
                      " could not find free promoter " + promoter_name +
                      " to bind in the polymer " + name_;
    throw std::runtime_error(err);
  }
  // Randomly select promoter.
  BindingSite::Ptr elem = Random::WeightedChoice(promoter_choices);
  // More error checking.
  if (!elem->CheckInteraction(pol->name())) {
    std::string err = "Polymerase " + pol->name() +
                      " does not interact with promoter " + promoter_name;
    throw std::runtime_error(err);
  }
  return elem;
}